

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int test_describe_zones(void)

{
  code *pcVar1;
  char *__s;
  SlbDescribeZonesRequestType *pSVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_181;
  int ret;
  HttpTestListener *local_160;
  HttpTestListener *listener;
  string local_150;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [55];
  allocator<char> local_c9;
  string local_c8 [32];
  SlbDescribeZonesRequestType *local_a8;
  Slb *slb;
  SlbDescribeZonesResponseType resp;
  SlbDescribeZonesRequestType req;
  
  aliyun::SlbDescribeZonesRequestType::SlbDescribeZonesRequestType
            ((SlbDescribeZonesRequestType *)
             &resp.zones.
              super__Vector_base<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  aliyun::SlbDescribeZonesResponseType::SlbDescribeZonesResponseType
            ((SlbDescribeZonesResponseType *)&slb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c8,"cn-hangzhou",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"my_appid",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"my_secret",&local_129);
  pSVar2 = (SlbDescribeZonesRequestType *)aliyun::Slb::CreateSlbClient(local_c8,local_100,local_128)
  ;
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  local_a8 = pSVar2;
  if (pSVar2 == (SlbDescribeZonesRequestType *)0x0) {
    aliyun::SlbDescribeZonesResponseType::~SlbDescribeZonesResponseType
              ((SlbDescribeZonesResponseType *)&slb);
    aliyun::SlbDescribeZonesRequestType::~SlbDescribeZonesRequestType
              ((SlbDescribeZonesRequestType *)
               &resp.zones.
                super__Vector_base<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetProxyHost((Slb *)pSVar2,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetUseTls((Slb *)local_a8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_zones_response;
  local_160 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_181);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_181);
  HttpTestListener::Start(local_160);
  std::__cxx11::string::operator=
            ((string *)
             &resp.zones.
              super__Vector_base<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Slb::DescribeZones
            (local_a8,(SlbDescribeZonesResponseType *)
                      &resp.zones.
                       super__Vector_base<aliyun::SlbDescribeZonesZoneType,_std::allocator<aliyun::SlbDescribeZonesZoneType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(SlbErrorInfo *)&slb);
  HttpTestListener::WaitComplete(local_160);
  pHVar3 = local_160;
  if (local_160 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_160);
    operator_delete(pHVar3,0x180);
  }
  pSVar2 = local_a8;
  if (local_a8 != (SlbDescribeZonesRequestType *)0x0) {
    aliyun::Slb::~Slb((Slb *)local_a8);
    operator_delete(pSVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_zones() {
  SlbDescribeZonesRequestType req;
  SlbDescribeZonesResponseType resp;
  Slb* slb = Slb::CreateSlbClient("cn-hangzhou", "my_appid", "my_secret");
  if(!slb) return 0;
  slb->SetProxyHost("127.0.0.1:12234");
  slb->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_zones_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  int ret = slb->DescribeZones(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete slb;
}